

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_parser.cpp
# Opt level: O1

bool __thiscall
dxil_spv::DXILContainerParser::parse_dxil(DXILContainerParser *this,MemoryStream *stream)

{
  pointer puVar1;
  undefined1 uVar2;
  ssize_t sVar3;
  size_t sVar4;
  void *__buf;
  size_t in_RCX;
  size_t bitcode_size;
  ProgramHeader program_header;
  MemoryStream substream;
  undefined1 auStack_48 [8];
  int local_40;
  uint local_38;
  uint local_34;
  MemoryStream local_30;
  
  sVar3 = MemoryStream::read(stream,(int)auStack_48,(void *)0x18,in_RCX);
  uVar2 = 0;
  if (((char)sVar3 != '\0') && (local_40 == 0x4c495844)) {
    if (local_38 < 0x10) {
      uVar2 = 0;
    }
    else {
      sVar4 = MemoryStream::get_offset(stream);
      bitcode_size = (size_t)local_34;
      MemoryStream::create_substream_bitcode_size
                (&local_30,stream,(local_38 + sVar4) - 0x10,bitcode_size);
      sVar4 = MemoryStream::get_size(&local_30);
      std::vector<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>::resize
                (&this->dxil_blob,sVar4);
      puVar1 = (this->dxil_blob).
               super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __buf = (void *)MemoryStream::get_size(&local_30);
      sVar3 = MemoryStream::read(&local_30,(int)puVar1,__buf,bitcode_size);
      uVar2 = (undefined1)sVar3;
    }
  }
  return (bool)uVar2;
}

Assistant:

bool DXILContainerParser::parse_dxil(MemoryStream &stream)
{
	DXIL::ProgramHeader program_header;
	if (!stream.read(program_header))
		return false;

	if (static_cast<DXIL::FourCC>(program_header.dxil_magic) != DXIL::FourCC::DXIL)
		return false;

	constexpr uint32_t DxilMagicPad = sizeof(DXIL::ProgramHeader) - offsetof(DXIL::ProgramHeader, dxil_magic);

	if (program_header.bitcode_offset < DxilMagicPad)
		return false;

	auto substream = stream.create_substream_bitcode_size(
		stream.get_offset() + program_header.bitcode_offset - DxilMagicPad,
		program_header.bitcode_size);

	dxil_blob.resize(substream.get_size());
	if (!substream.read(dxil_blob.data(), substream.get_size()))
		return false;

	return true;
}